

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O0

string * __thiscall amrex::ForkJoin::get_io_filename_abi_cxx11_(ForkJoin *this,bool flag_unique)

{
  undefined1 uVar1;
  byte bVar2;
  byte in_DL;
  long in_RSI;
  string *in_RDI;
  string *in_stack_00000010;
  int i;
  string result_base;
  string *result;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_fffffffffffffe08;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
  *in_stack_fffffffffffffe30;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
  *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe4c;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [36];
  int local_10c;
  string local_108 [32];
  string local_e8 [39];
  undefined1 local_c1 [57];
  string local_88 [32];
  string local_68 [24];
  string *in_stack_ffffffffffffffb0;
  Vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  undefined1 local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = 0;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffed;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_00,"",(allocator *)__lhs);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffed);
  uVar1 = std::operator!=(in_stack_fffffffffffffe00,
                          (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
  if ((bool)uVar1) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,(string *)(in_RSI + 0x90));
    anon_unknown.dwarf_9a2384::get_frame_id_vec();
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_c1 + 1),"-",(allocator *)__rhs);
    anon_unknown.dwarf_9a2384::str_join<int>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::operator+((char *)CONCAT17(uVar1,in_stack_fffffffffffffe08),__rhs);
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb8,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)(local_c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c1);
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x1213732);
    ParallelContext::MyProcSub();
    std::__cxx11::to_string(in_stack_fffffffffffffe4c);
    std::operator+((char *)CONCAT17(uVar1,in_stack_fffffffffffffe08),__rhs);
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb8,local_e8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_108);
    if ((local_11 & 1) == 0) {
      std::operator+(__lhs,(char *)this_00);
      std::__cxx11::string::operator=((string *)this_00,(string *)&stack0xfffffffffffffe30);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
    }
    else {
      local_10c = 0;
      do {
        std::operator+(__lhs,(char *)this_00);
        local_10c = local_10c + 1;
        std::__cxx11::to_string(in_stack_fffffffffffffe4c);
        std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar1,in_stack_fffffffffffffe08),(char *)__rhs);
        std::__cxx11::string::operator=((string *)this_00,local_130);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_150);
        std::__cxx11::string::~string(local_190);
        std::__cxx11::string::~string(local_170);
        std::__cxx11::string::string(local_1b0,(string *)this_00);
        bVar2 = anon_unknown.dwarf_9a2384::file_exists(in_stack_00000010);
        std::__cxx11::string::~string(local_1b0);
      } while ((bVar2 & 1) != 0);
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  }
  return in_RDI;
}

Assistant:

std::string
ForkJoin::get_io_filename (bool flag_unique)
{
    std::string result = "";

    if (task_output_dir != "") {
        // build base filename
        std::string result_base = task_output_dir;
        result_base += "/T-" + str_join(get_frame_id_vec(), "-");
        result_base += ".R-" + std::to_string(ParallelContext::MyProcSub());

        if (flag_unique) {
            // concatenate an integer to the end to make unique
            int i = 0;
            do {
                result = result_base + ".I-" + std::to_string(i++) + ".out";
            } while (file_exists(result));
        } else {
            result = result_base + ".out";
        }
    }

    return result;
}